

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

int __thiscall smf::Options::storeOption(Options *this,int gargp,int *position,int *running)

{
  char cVar1;
  char cVar2;
  reference pvVar3;
  char *pcVar4;
  ostream *poVar5;
  bool bVar6;
  allocator local_511;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [39];
  allocator local_4c1;
  string local_4c0 [39];
  allocator local_499;
  string local_498 [55];
  allocator local_461;
  string local_460 [39];
  char local_439;
  char local_438 [7];
  char optionType;
  char tempname [1024];
  int optionForm;
  int *running_local;
  int *position_local;
  int gargp_local;
  Options *this_local;
  
  local_439 = '\0';
  if (*running == 0) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,(long)gargp);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
    cVar1 = *pcVar4;
    cVar2 = getFlag(this);
    tempname[0x3fd] = '\0';
    tempname[0x3fe] = '\0';
    tempname[0x3ff] = '\0';
    tempname[0x3fc] = cVar1 == cVar2;
  }
  else {
    tempname[0x3fc] = '\x02';
    tempname[0x3fd] = '\0';
    tempname[0x3fe] = '\0';
    tempname[0x3ff] = '\0';
  }
  if (tempname._1020_4_ == 0) {
    *position = 1;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,(long)gargp);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
    local_438[0] = *pcVar4;
    local_438[1] = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_498,local_438,&local_499);
    local_439 = getType(this,(string *)local_498);
    std::__cxx11::string::~string(local_498);
    std::allocator<char>::~allocator((allocator<char> *)&local_499);
    if (local_439 != 'b') {
      *position = *position + 1;
    }
  }
  else if (tempname._1020_4_ == 1) {
    *position = 2;
    while( true ) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->m_oargv,(long)gargp);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
      bVar6 = false;
      if (*pcVar4 != '=') {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->m_oargv,(long)gargp);
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
        bVar6 = *pcVar4 != '\0';
      }
      if (!bVar6) break;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->m_oargv,(long)gargp);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
      local_438[*position + -2] = *pcVar4;
      *position = *position + 1;
    }
    local_438[*position + -2] = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c0,local_438,&local_4c1);
    local_439 = getType(this,(string *)local_4c0);
    std::__cxx11::string::~string(local_4c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    if (local_439 == -1) {
      this->m_optionsArgument = 1;
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->m_oargv,(long)gargp);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
      if (*pcVar4 == '=') {
        if (local_439 == 'b') {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "Error: boolean variable cannot have any options: ");
          poVar5 = std::operator<<(poVar5,local_438);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
        *position = *position + 1;
      }
    }
  }
  else if (tempname._1020_4_ == 2) {
    *position = *position + 1;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,(long)gargp);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
    local_438[0] = *pcVar4;
    local_438[1] = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_460,local_438,&local_461);
    local_439 = getType(this,(string *)local_460);
    std::__cxx11::string::~string(local_460);
    std::allocator<char>::~allocator((allocator<char> *)&local_461);
    if (local_439 != 'b') {
      *running = 0;
      *position = *position + 1;
    }
  }
  if (local_439 == -1) {
    this->m_optionsArgument = 1;
    *position = 0;
    return gargp + 1;
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->m_oargv,(long)gargp);
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
  position_local._4_4_ = gargp;
  if ((*pcVar4 == '\0') && (local_439 != 'b')) {
    position_local._4_4_ = gargp + 1;
    *position = 0;
  }
  if ((tempname._1020_4_ != 1) && (local_439 == 'b')) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,(long)position_local._4_4_);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
    if (*pcVar4 != '\0') {
      *running = 1;
      goto LAB_0013616c;
    }
  }
  if (local_439 == 'b') {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,(long)position_local._4_4_);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
    if (*pcVar4 == '\0') {
      *running = 0;
    }
  }
LAB_0013616c:
  if (position_local._4_4_ < this->m_oargc) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4e8,local_438,&local_4e9);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,(long)position_local._4_4_);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_510,pcVar4,&local_511);
    setModified(this,(string *)local_4e8,(string *)local_510);
    std::__cxx11::string::~string(local_510);
    std::allocator<char>::~allocator((allocator<char> *)&local_511);
    std::__cxx11::string::~string(local_4e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
    if (*running == 0) {
      position_local._4_4_ = position_local._4_4_ + 1;
    }
    return position_local._4_4_;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Error: last option requires a parameter");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

int Options::storeOption(int gargp, int& position, int& running) {
   int optionForm;
   char tempname[1024];
   char optionType = '\0';

   if (running) {
      optionForm = OPTION_FORM_CONTINUE;
   } else if (m_oargv[gargp][1] == getFlag()) {
      optionForm = OPTION_FORM_LONG;
   } else {
      optionForm = OPTION_FORM_SHORT;
   }

   switch (optionForm) {
      case OPTION_FORM_CONTINUE:
         position++;
         tempname[0] = m_oargv[gargp][position];
         tempname[1] = '\0';
         optionType = getType(tempname);
         if (optionType != OPTION_BOOLEAN_TYPE) {
            running = 0;
            position++;
         }
         break;
      case OPTION_FORM_SHORT:
         position = 1;
         tempname[0] = m_oargv[gargp][position];
         tempname[1] = '\0';
         optionType = getType(tempname);
         if (optionType != OPTION_BOOLEAN_TYPE) {
            position++;
         }
         break;
      case OPTION_FORM_LONG:
         position = 2;
         while (m_oargv[gargp][position] != '=' &&
               m_oargv[gargp][position] != '\0') {
            tempname[position-2] = m_oargv[gargp][position];
            position++;
         }
         tempname[position-2] = '\0';
         optionType = getType(tempname);
         if (optionType == -1) {         // suppressed --options option
            m_optionsArgument = 1;
            break;
         }
         if (m_oargv[gargp][position] == '=') {
            if (optionType == OPTION_BOOLEAN_TYPE) {
               std::cerr << "Error: boolean variable cannot have any options: "
                    << tempname << std::endl;
               exit(1);
            }
            position++;
         }
         break;
   }

   if (optionType == -1) {              // suppressed --options option
      m_optionsArgument = 1;
      gargp++;
      position = 0;
      return gargp;
   }

   if (m_oargv[gargp][position] == '\0' &&
         optionType != OPTION_BOOLEAN_TYPE) {
      gargp++;
      position = 0;
   }

   if (optionForm != OPTION_FORM_LONG && optionType == OPTION_BOOLEAN_TYPE &&
         m_oargv[gargp][position+1] != '\0') {
      running = 1;
   } else if (optionType == OPTION_BOOLEAN_TYPE &&
         m_oargv[gargp][position+1] == '\0') {
      running = 0;
   }

   if (gargp >= m_oargc) {
      std::cerr << "Error: last option requires a parameter" << std::endl;
      exit(1);
   }
   setModified(tempname, &m_oargv[gargp][position]);

   if (!running) {
      gargp++;
   }
   return gargp;
}